

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backward_references_enc.c
# Opt level: O0

void VP8LRefsCursorNextBlock(VP8LRefsCursor *c)

{
  PixOrCopyBlock *pPVar1;
  PixOrCopy *local_20;
  PixOrCopy *local_18;
  PixOrCopyBlock *b;
  VP8LRefsCursor *c_local;
  
  pPVar1 = c->cur_block->next;
  if (pPVar1 == (PixOrCopyBlock *)0x0) {
    local_18 = (PixOrCopy *)0x0;
  }
  else {
    local_18 = pPVar1->start;
  }
  c->cur_pos = local_18;
  if (pPVar1 == (PixOrCopyBlock *)0x0) {
    local_20 = (PixOrCopy *)0x0;
  }
  else {
    local_20 = pPVar1->start + pPVar1->size;
  }
  c->last_pos = local_20;
  c->cur_block = pPVar1;
  return;
}

Assistant:

void VP8LRefsCursorNextBlock(VP8LRefsCursor* const c) {
  PixOrCopyBlock* const b = c->cur_block->next;
  c->cur_pos = (b == NULL) ? NULL : b->start;
  c->last_pos = (b == NULL) ? NULL : b->start + b->size;
  c->cur_block = b;
}